

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
llb_buildsystem_command_interface_spawn::ForwardingProcessDelegate::processHadError(llbuild::basic::
ProcessContext*,llbuild::basic::ProcessHandle,llvm::Twine_const__
          (void *this,ProcessContext *ctx,ProcessHandle handle,Twine *message)

{
  llb_data_t err;
  string errStr;
  string local_30;
  
  if (*(long *)((long)this + 8) != 0) {
    llvm::Twine::str_abi_cxx11_(&local_30,message);
    (*(code *)(*(undefined8 **)((long)this + 8))[2])(**(undefined8 **)((long)this + 8));
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {
      if (delegate != NULL) {
        auto errStr = message.str();
        llb_data_t err{ errStr.size(), (const uint8_t*) errStr.data() };
        delegate->process_had_error(delegate->context, &err);
      }
    }